

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_data_segment_info(data_segment sec)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  data_pointer paVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  paVar5 = sec.data_segment_addr;
  if (sec.data_segment_count != 0) {
    uVar6 = 0;
    do {
      printf("  - data[%d] memory=0 offset=%lu count=%lu: \n",uVar6,(ulong)*paVar5[uVar6].offset.arg
             ,paVar5[uVar6].init_data_count);
      uVar7 = 0;
      uVar3 = 0;
      do {
        uVar4 = (ulong)uVar7;
        printf("    ");
        lVar8 = 8;
        uVar9 = uVar4;
        do {
          if (uVar9 < paVar5[uVar6].init_data_count) {
            printf("%02x ",(ulong)paVar5[uVar6].init_data[uVar9]);
          }
          else {
            printf("   ");
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        printf("-> [");
        lVar8 = 8;
        do {
          if (paVar5[uVar6].init_data_count <= uVar4) break;
          bVar2 = paVar5[uVar6].init_data[uVar4];
          if (0x5e < (byte)(bVar2 - 0x20)) {
            bVar2 = 0x20;
          }
          putchar((uint)bVar2);
          uVar4 = uVar4 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        puts("]");
        uVar7 = uVar7 + 8;
        bVar1 = uVar3 < paVar5[uVar6].init_data_count >> 3;
        uVar3 = uVar3 + 1;
      } while (bVar1);
      uVar6 = uVar6 + 1;
    } while (uVar6 != (sec._0_8_ & 0xffffffff));
  }
  return;
}

Assistant:

void print_data_segment_info(data_segment sec) {
    data_pointer dp;
    uint64 offset;
    for (int i = 0; i < sec.data_segment_count; ++i) {
        dp = sec.data_segment_addr + i;
        offset = *(uint32 *) (dp->offset.arg);
        printf("  - data[%d] memory=0 offset=%lu count=%lu: \n", i, offset, dp->init_data_count);
        for (int j = 0; j <= dp->init_data_count / 8; ++j) {
            printf("    ");
            for (int k = 0; k < 8; ++k) {
                uint64 index = j * 8 + k;
                if (index < dp->init_data_count) printf("%02x ", *(dp->init_data + index)); else printf("   ");
            }
            printf("-> [");
            for (int k = 0; k < 8; ++k) {
                uint64 index = j * 8 + k;
                if (index < dp->init_data_count) printf("%c", toPrintAble(*(dp->init_data + index))); else break;
            }
            printf("]\n");
        }
    }
}